

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O1

int ffibin(fitsfile *fptr,LONGLONG naxis2,int tfields,char **ttype,char **tform,char **tunit,
          char *extnmx,LONGLONG pcount,int *status)

{
  int iVar1;
  int iVar2;
  FITSfile *pFVar3;
  LONGLONG LVar4;
  LONGLONG *pLVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  int datacode;
  char **local_f0;
  ulong local_e8;
  long width;
  char extnm [71];
  long repeat;
  
  iVar7 = *status;
  if (iVar7 < 1) {
    uVar12 = (ulong)(uint)tfields;
    extnm[0] = '\0';
    if (extnmx != (char *)0x0) {
      strncat(extnm,extnmx,0x46);
    }
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    pFVar3 = fptr->Fptr;
    if ((pFVar3->headend == pFVar3->headstart[pFVar3->curhdu]) ||
       ((pFVar3->curhdu == pFVar3->maxhdu &&
        (pFVar3->logfilesize <= pFVar3->headstart[(long)pFVar3->maxhdu + 1])))) {
      ffcrtb(fptr,2,naxis2,tfields,ttype,tform,tunit,extnm,status);
      iVar7 = *status;
    }
    else if (naxis2 < 0) {
      *status = 0xda;
      iVar7 = 0xda;
    }
    else if ((uint)tfields < 1000) {
      if (tfields == 0) {
        iVar7 = 0;
      }
      else {
        uVar10 = 0;
        iVar7 = 0;
        do {
          if ((tunit != (char **)0x0) && (*tunit != (char *)0x0)) {
            iVar7 = (iVar7 + 1) - (uint)(*tunit[uVar10] == '\0');
          }
          uVar10 = uVar10 + 1;
        } while ((uint)tfields != uVar10);
      }
      bVar13 = extnm[0] == '\0';
      local_f0 = ttype;
      local_e8 = uVar12;
      if (tfields == 0) {
        lVar11 = 0;
      }
      else {
        uVar12 = 1;
        if (1 < tfields) {
          uVar12 = (ulong)(uint)tfields;
        }
        uVar10 = 0;
        lVar11 = 0;
        do {
          ffbnfm(tform[uVar10],&datacode,&repeat,&width,status);
          lVar9 = repeat;
          if (datacode != 0x10) {
            if (datacode == 1) {
              lVar9 = repeat + 0xe;
              if (-1 < repeat + 7) {
                lVar9 = repeat + 7;
              }
              lVar9 = lVar9 >> 3;
            }
            else {
              lVar9 = repeat * width;
            }
          }
          lVar11 = lVar11 + lVar9;
          uVar10 = uVar10 + 1;
        } while (uVar12 != uVar10);
      }
      if (fptr->Fptr->writemode == 1) {
        iVar6 = (int)(((iVar7 + tfields * 2) - (uint)bVar13) + 0x2d) / 0x24;
        ffrdef(fptr,status);
        ffpdfl(fptr,status);
        pFVar3 = fptr->Fptr;
        iVar7 = pFVar3->curhdu;
        LVar4 = pFVar3->headstart[(long)iVar7 + 1];
        pFVar3->hdutype = 2;
        iVar8 = ffiblk(fptr,(long)iVar6 + (pcount + lVar11 * naxis2 + 0xb3f) / 0xb40,1,status);
        if (iVar8 < 1) {
          pFVar3 = fptr->Fptr;
          iVar1 = pFVar3->maxhdu;
          iVar8 = iVar1 + 1;
          pFVar3->maxhdu = iVar8;
          iVar2 = pFVar3->curhdu;
          if (iVar2 <= iVar1) {
            pLVar5 = pFVar3->headstart;
            lVar11 = (long)iVar8;
            do {
              pLVar5[lVar11 + 1] = pLVar5[lVar11];
              lVar11 = lVar11 + -1;
            } while (iVar2 < lVar11);
          }
          pLVar5 = pFVar3->headstart;
          pLVar5[(long)iVar7 + 1] = LVar4;
          pFVar3->curhdu = iVar7 + 1;
          fptr->HDUposition = iVar7 + 1;
          pFVar3->nextkey = LVar4;
          pFVar3->headend = pLVar5[(long)iVar7 + 1];
          pFVar3->datastart = (long)(iVar6 * 0xb40) + pLVar5[(long)iVar7 + 1];
          pFVar3->hdutype = 2;
          ffphbn(fptr,naxis2,(int)local_e8,local_f0,tform,tunit,extnm,pcount,status);
          ffrdef(fptr,status);
        }
        iVar7 = *status;
      }
      else {
        *status = 0x70;
        iVar7 = 0x70;
      }
    }
    else {
      snprintf((char *)&repeat,0x51,"Illegal value for TFIELDS keyword: %d",uVar12);
      ffpmsg((char *)&repeat);
      *status = 0xd8;
      iVar7 = 0xd8;
    }
  }
  return iVar7;
}

Assistant:

int ffibin(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,     /* I - value of EXTNAME keyword, if any         */
           LONGLONG pcount, /* I - size of special data area (heap)         */
           int *status)     /* IO - error status                            */
/*
  insert a Binary table extension following the current HDU 
*/
{
    int nexthdu, maxhdu, ii, nunit, nhead, datacode;
    LONGLONG naxis1;
    long nblocks, repeat, width;
    LONGLONG datasize, newstart;
    char errmsg[FLEN_ERRMSG], extnm[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    extnm[0] = '\0';
    if (extnmx)
      strncat(extnm, extnmx, FLEN_VALUE-1);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    maxhdu = (fptr->Fptr)->maxhdu;
    /* if the current header is completely empty ...  */
    if (( (fptr->Fptr)->headend == (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        /* or, if we are at the end of the file, ... */
    ||  ( (((fptr->Fptr)->curhdu) == maxhdu ) &&
       ((fptr->Fptr)->headstart[maxhdu + 1] >= (fptr->Fptr)->logfilesize ) ) )
    {
        /* then simply append new image extension */
        ffcrtb(fptr, BINARY_TBL, naxis2, tfields, ttype, tform, tunit,
               extnm, status);
        return(*status);
    }

    if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (tfields < 0 || tfields > 999)
    {
        snprintf(errmsg, FLEN_ERRMSG,
        "Illegal value for TFIELDS keyword: %d", tfields);
        ffpmsg(errmsg);
        return(*status = BAD_TFIELDS);
    }

    /* count number of optional TUNIT keywords to be written */
    nunit = 0;
    for (ii = 0; ii < tfields; ii++)
    {
        if (tunit && *tunit && *tunit[ii])
            nunit++;
    }

    if (*extnm)
         nunit++;     /* add one for the EXTNAME keyword */

    nhead = (9 + (2 * tfields) + nunit + 35) / 36;  /* no. of header blocks */

    /* calculate total width of the table */
    naxis1 = 0;
    for (ii = 0; ii < tfields; ii++)
    {
        ffbnfm(tform[ii], &datacode, &repeat, &width, status);

        if (datacode == TBIT)
            naxis1 = naxis1 + ((repeat + 7) / 8);
        else if (datacode == TSTRING)
            naxis1 += repeat;
        else
            naxis1 = naxis1 + (repeat * width);
    }

    datasize = ((LONGLONG)naxis1 * naxis2) + pcount;         /* size of table in bytes */
    nblocks = (long) ((datasize + 2879) / 2880) + nhead;  /* size of HDU */

    if ((fptr->Fptr)->writemode == READWRITE) /* must have write access */
    {   /* close the CHDU */
        ffrdef(fptr, status);  /* scan header to redefine structure */
        ffpdfl(fptr, status);  /* insure correct data file values */
    }
    else
        return(*status = READONLY_FILE);

    nexthdu = ((fptr->Fptr)->curhdu) + 1; /* number of the next (new) hdu */
    newstart = (fptr->Fptr)->headstart[nexthdu]; /* save starting addr of HDU */

    (fptr->Fptr)->hdutype = BINARY_TBL;  /* so that correct fill value is used */

    /* ffiblk also increments headstart for all following HDUs */
    if (ffiblk(fptr, nblocks, 1, status) > 0)  /* insert the blocks */
        return(*status);

    ((fptr->Fptr)->maxhdu)++;      /* increment known number of HDUs in the file */
    for (ii = (fptr->Fptr)->maxhdu; ii > (fptr->Fptr)->curhdu; ii--)
        (fptr->Fptr)->headstart[ii + 1] = (fptr->Fptr)->headstart[ii]; /* incre start addr */

    (fptr->Fptr)->headstart[nexthdu] = newstart; /* set starting addr of HDU */

    /* set default parameters for this new empty HDU */
    (fptr->Fptr)->curhdu = nexthdu;   /* we are now located at the next HDU */
    fptr->HDUposition = nexthdu;      /* we are now located at the next HDU */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[nexthdu];  
    (fptr->Fptr)->headend = (fptr->Fptr)->headstart[nexthdu];
    (fptr->Fptr)->datastart = ((fptr->Fptr)->headstart[nexthdu]) + (nhead * 2880);
    (fptr->Fptr)->hdutype = BINARY_TBL;  /* might need to be reset... */

    /* write the required header keywords. This will write PCOUNT = 0 */
    /* so that the variable length data will be written at the right place */
    ffphbn(fptr, naxis2, tfields, ttype, tform, tunit, extnm, pcount,
           status);

    /* redefine internal structure for this HDU (with PCOUNT = 0) */
    ffrdef(fptr, status);

    return(*status);
}